

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

extent_t *
extent_alloc_wrapper
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,void *new_addr,size_t size,
          size_t pad,size_t alignment,_Bool slab,szind_t szind,_Bool *zero,_Bool *commit)

{
  extent_t *peVar1;
  size_t in_RCX;
  size_t in_RDX;
  _Bool *unaff_RBX;
  void *in_RSI;
  tsdn_t *in_RDI;
  undefined8 in_R8;
  void *unaff_R14;
  extent_hooks_t **unaff_retaddr;
  arena_t *in_stack_00000008;
  undefined1 in_stack_00000010;
  undefined7 in_stack_00000011;
  extent_t *extent;
  undefined7 in_stack_00000030;
  tsd_t *tsd;
  uint8_t state;
  extent_hooks_t **in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 slab_00;
  arena_t *in_stack_ffffffffffffffa0;
  tsdn_t *in_stack_ffffffffffffffa8;
  witness_tsd_t *local_48;
  undefined7 in_stack_ffffffffffffffd0;
  uint8_t in_stack_ffffffffffffffd7;
  tsdn_t *in_stack_ffffffffffffffe0;
  tsdn_t *in_stack_ffffffffffffffe8;
  
  slab_00 = (undefined1)((ulong)in_R8 >> 0x38);
  if (in_RDI == (tsdn_t *)0x0) {
    local_48 = (witness_tsd_t *)0x0;
  }
  else {
    in_stack_ffffffffffffffd7 = (in_RDI->tsd).state.repr;
    local_48 = &(in_RDI->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
    in_stack_ffffffffffffffa8 = in_RDI;
    in_stack_ffffffffffffffe0 = in_RDI;
    in_stack_ffffffffffffffe8 = in_RDI;
  }
  witness_assert_depth_to_rank((witness_tsdn_t *)local_48,0xc,0);
  extent_hooks_assure_initialized
            ((arena_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  peVar1 = extent_alloc_retained
                     (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(extent_hooks_t **)in_RDI,
                      in_RSI,in_RDX,in_RCX,
                      CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),(_Bool)slab_00,
                      (szind_t)in_stack_ffffffffffffffe0,(_Bool *)in_stack_ffffffffffffffe8,
                      unaff_RBX);
  if (peVar1 == (extent_t *)0x0) {
    if (((opt_retain & 1U) == 0) || (in_RCX == 0)) {
      peVar1 = extent_alloc_wrapper_hard
                         ((tsdn_t *)CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_00000008,
                          unaff_retaddr,unaff_R14,(size_t)unaff_RBX,
                          (size_t)in_stack_ffffffffffffffe8,CONCAT17(slab,in_stack_00000030),
                          SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x38,0),(szind_t)size,
                          (_Bool *)new_addr,(_Bool *)r_extent_hooks);
    }
    else {
      peVar1 = (extent_t *)0x0;
    }
  }
  return peVar1;
}

Assistant:

extent_t *
extent_alloc_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_hooks_assure_initialized(arena, r_extent_hooks);

	extent_t *extent = extent_alloc_retained(tsdn, arena, r_extent_hooks,
	    new_addr, size, pad, alignment, slab, szind, zero, commit);
	if (extent == NULL) {
		if (opt_retain && new_addr != NULL) {
			/*
			 * When retain is enabled and new_addr is set, we do not
			 * attempt extent_alloc_wrapper_hard which does mmap
			 * that is very unlikely to succeed (unless it happens
			 * to be at the end).
			 */
			return NULL;
		}
		extent = extent_alloc_wrapper_hard(tsdn, arena, r_extent_hooks,
		    new_addr, size, pad, alignment, slab, szind, zero, commit);
	}

	assert(extent == NULL || extent_dumpable_get(extent));
	return extent;
}